

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::SymbolAccess::Write(SymbolAccess *this,string *name,string *value)

{
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  SymbolEntry entry;
  string local_1f8;
  SymbolEntryMap entries;
  stringstream stream;
  ostream local_198 [376];
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&entries._M_t,this);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          ::find(&entries._M_t,name);
  if ((_Rb_tree_header *)cVar2._M_node == &entries._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_198,"Write");
    poVar3 = std::operator<<(poVar3,"(): symbol \'");
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,"\' not found\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    iVar1 = 0x710;
    goto LAB_0012dc8d;
  }
  SymbolEntry::SymbolEntry(&entry,(SymbolEntry *)(cVar2._M_node + 2));
  switch(entry.header.dataType) {
  case 2:
    iVar1 = Write<short>(this,&entry,value);
    break;
  case 3:
    iVar1 = Write<int>(this,&entry,value);
    break;
  case 4:
    iVar1 = Write<float>(this,&entry,value);
    break;
  case 5:
    iVar1 = Write<double>(this,&entry,value);
    break;
  case 0x11:
switchD_0012dad9_caseD_11:
    iVar1 = Write<unsigned_char>(this,&entry,value);
    break;
  case 0x12:
    iVar1 = Write<unsigned_short>(this,&entry,value);
    break;
  case 0x13:
    iVar1 = Write<unsigned_int>(this,&entry,value);
    break;
  case 0x15:
    iVar1 = Write<unsigned_long>(this,&entry,value);
    break;
  default:
    if (entry.header.dataType == 0x21) goto switchD_0012dad9_caseD_11;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_198,"Write");
    poVar3 = std::operator<<(poVar3,"() Unknown type \'");
    poVar3 = std::operator<<(poVar3,(string *)&entry.typeName);
    std::operator<<(poVar3,"\' writting as string\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    iVar1 = Write<std::__cxx11::string>(this,&entry,value);
  }
  SymbolEntry::~SymbolEntry(&entry);
LAB_0012dc8d:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~_Rb_tree(&entries._M_t);
  return iVar1;
}

Assistant:

int SymbolAccess::Write(const std::string& name, const std::string& value) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;

    switch (entry.header.dataType) {
    case 0x2:     //INT
        return Write<int16_t>(entry, value);

    case 0x3:     //DINT
        return Write<int32_t>(entry, value);

    case 0x4:     //REAL
        return Write<float>(entry, value);

    case 0x5:     //LREAL
        return Write<double>(entry, value);

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        return Write<uint8_t>(entry, value);

    case 0x12:     // WORD, UINT
        return Write<uint16_t>(entry, value);

    case 0x13:     // DWORD, UDINT
        return Write<uint32_t>(entry, value);

    case 0x15:     // LWORD, ULINT
        return Write<uint64_t>(entry, value);

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' writting as string\n");
        return Write<std::string>(entry, value);
    }
}